

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O1

Maybe<capnp::Orphan<capnp::compiler::Declaration>_> * __thiscall
capnp::compiler::CapnpParser::parseStatement
          (Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *__return_storage_ptr__,
          CapnpParser *this,Reader statement,DeclParser *parser)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  StructBuilder other;
  Reader statement_00;
  Orphan<capnp::compiler::Declaration> *pOVar4;
  RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *pRVar5;
  Orphan<capnp::compiler::Declaration> *pOVar6;
  int iVar7;
  PointerType PVar8;
  short sVar9;
  undefined4 uVar10;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar11;
  long lVar12;
  undefined4 uVar13;
  ulong uVar14;
  DeclParser *pDVar15;
  size_t newSize;
  DeclParser *parser_00;
  ulong uVar16;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar17;
  ElementCount index;
  Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *pMVar18;
  Reader value;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> member;
  Array<capnp::Orphan<capnp::compiler::Declaration>_> result;
  Reader memberStatements;
  ParserInput parserInput;
  NullableValue<capnp::compiler::CapnpParser::DeclParserResult> output;
  Reader memberStatement;
  Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> result_1;
  BuilderFor<capnp::compiler::Declaration> builder;
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  fullParser;
  Reader tokens;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> local_268;
  CapnpParser *local_248;
  undefined1 local_240 [16];
  SegmentBuilder *pSStack_230;
  WirePointer *pWStack_228;
  word *pwStack_220;
  Orphan<capnp::compiler::Declaration> *local_218;
  ulong uStack_210;
  ArrayDisposer *local_208;
  undefined1 local_1f8 [8];
  anon_union_56_1_a8c68091_for_NullableValue<capnp::compiler::CapnpParser::DeclParserResult>_2
  aStack_1f0;
  Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *local_1b8;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  local_1b0;
  undefined1 local_178 [16];
  SegmentBuilder *pSStack_168;
  CapTableBuilder *local_160;
  word *pwStack_158;
  char local_150;
  DeclParser local_148;
  bool local_138 [8];
  anon_union_32_1_a8c68091_for_NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>_2
  local_130;
  StructReader local_110;
  OrphanBuilder local_e0;
  OrphanBuilder local_c0;
  StructBuilder local_a0;
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  local_78;
  ListReader local_60;
  
  local_78.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_178._8_8_ = statement._reader.capTable;
  pSStack_168 = (SegmentBuilder *)statement._reader.pointers;
  local_178._0_8_ = statement._reader.segment;
  iVar7 = statement._reader.nestingLimit;
  if (statement._reader.pointerCount == 0) {
    local_178._8_8_ = (CapTableReader *)0x0;
    pSStack_168 = (SegmentBuilder *)0x0;
    local_178._0_8_ = (SegmentReader *)0x0;
    iVar7 = 0x7fffffff;
  }
  local_160 = (CapTableBuilder *)CONCAT44(local_160._4_4_,iVar7);
  local_248 = this;
  local_1b8 = __return_storage_ptr__;
  local_78.first = parser;
  capnp::_::PointerReader::getList
            (&local_60,(PointerReader *)local_178,INLINE_COMPOSITE,(word *)0x0);
  local_1b0.parent =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  local_1b0.pos.index = 0;
  local_1b0.end.index = local_60.elementCount;
  local_1b0.best.index = 0;
  local_1b0.pos.container = (Reader *)&local_60;
  local_1b0.end.container = (Reader *)&local_60;
  local_1b0.best.container = (Reader *)&local_60;
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  ::
  parseNext<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>_>
            ((Maybe<capnp::compiler::CapnpParser::DeclParserResult> *)local_1f8,&local_78,&local_1b0
            );
  pMVar18 = local_1b8;
  local_178[0] = local_1f8[0];
  if (local_1f8[0] == true) {
    local_160 = (CapTableBuilder *)CONCAT44(aStack_1f0._20_4_,aStack_1f0._16_4_);
    pwStack_158 = aStack_1f0.value.decl.builder.location;
    local_178._8_8_ = aStack_1f0.value.decl.builder.tag.content;
    pSStack_168 = aStack_1f0.value.decl.builder.segment;
    aStack_1f0.value.decl.builder.segment = (SegmentBuilder *)0x0;
    aStack_1f0.value.decl.builder.location = (word *)0x0;
    local_150 = aStack_1f0.value.memberParser.ptr.isSet;
    if (aStack_1f0.value.memberParser.ptr.isSet == true) {
      local_148.parser = (void *)aStack_1f0._40_8_;
      local_148.wrapper = (Wrapper *)aStack_1f0._48_8_;
    }
  }
  if ((local_1f8[0] != false) && (aStack_1f0.value.decl.builder.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_1f8 + 8));
  }
  if (local_178[0] == '\x01') {
    capnp::_::OrphanBuilder::asStruct
              (&local_a0,(OrphanBuilder *)(local_178 + 8),(StructSize)0x80002);
    if (statement._reader.pointerCount < 3) {
      local_1f8 = (undefined1  [8])0x0;
      aStack_1f0.value.decl.builder.tag.content = (word)0;
      aStack_1f0.value.decl.builder.segment = (SegmentBuilder *)0x0;
      aStack_1f0._16_4_ = 0x7fffffff;
    }
    else {
      aStack_1f0.value.decl.builder.segment = (SegmentBuilder *)(statement._reader.pointers + 2);
      local_1f8 = (undefined1  [8])statement._reader.segment;
      aStack_1f0.value.decl.builder.tag.content = (word)(word)statement._reader.capTable;
      aStack_1f0._16_4_ = statement._reader.nestingLimit;
    }
    PVar8 = capnp::_::PointerReader::getPointerType((PointerReader *)local_1f8);
    if (PVar8 != NULL_) {
      if (statement._reader.pointerCount < 3) {
        aStack_1f0._16_4_ = 0x7fffffff;
        aStack_1f0.value.decl.builder.tag.content = (word)(CapTableReader *)0x0;
        aStack_1f0.value.decl.builder.segment = (SegmentBuilder *)0x0;
        local_1f8 = (undefined1  [8])0x0;
      }
      else {
        aStack_1f0.value.decl.builder.segment = (SegmentBuilder *)(statement._reader.pointers + 2);
        aStack_1f0.value.decl.builder.tag.content = (word)statement._reader.capTable;
        local_1f8 = (undefined1  [8])statement._reader.segment;
        aStack_1f0._16_4_ = statement._reader.nestingLimit;
      }
      value = capnp::_::PointerReader::getBlob<capnp::Text>
                        ((PointerReader *)local_1f8,(void *)0x0,0);
      aStack_1f0.value.decl.builder.segment = (SegmentBuilder *)(local_a0.pointers + 4);
      local_1f8 = (undefined1  [8])local_a0.segment;
      aStack_1f0.value.decl.builder.tag.content = (word)(word)local_a0.capTable;
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_1f8,value);
    }
    uVar10 = 0;
    uVar13 = 0;
    if (0x3f < statement._reader.dataSize) {
      uVar13 = *(undefined4 *)((long)statement._reader.data + 4);
    }
    *(undefined4 *)((long)local_a0.data + 4) = uVar13;
    if (0x5f < statement._reader.dataSize) {
      uVar10 = *(undefined4 *)((long)statement._reader.data + 8);
    }
    *(undefined4 *)((long)local_a0.data + 8) = uVar10;
    if (statement._reader.dataSize < 0x10) {
      sVar9 = 0;
    }
    else {
      sVar9 = *statement._reader.data;
    }
    if (sVar9 == 1) {
      pDVar15 = (DeclParser *)0x0;
      parser_00 = &local_148;
      if (local_150 == '\0') {
        parser_00 = pDVar15;
      }
      if (local_150 == '\x01') {
        if (statement._reader.pointerCount < 2) {
          statement._reader.nestingLimit = 0x7fffffff;
          statement._reader.capTable = (CapTableReader *)0x0;
          local_110.data = (WirePointer *)0x0;
          statement._reader.segment = (SegmentReader *)0x0;
        }
        else {
          local_110.data = statement._reader.pointers + 1;
        }
        local_110.segment = statement._reader.segment;
        local_110.capTable = statement._reader.capTable;
        local_110.pointers._0_4_ = statement._reader.nestingLimit;
        capnp::_::PointerReader::getList
                  ((ListReader *)local_1f8,(PointerReader *)&local_110,INLINE_COMPOSITE,(word *)0x0)
        ;
        uVar16 = (ulong)(uint)aStack_1f0._16_4_;
        local_268.builder.ptr =
             (Orphan<capnp::compiler::Declaration> *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x20,0,uVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        uVar13 = aStack_1f0._16_4_;
        local_268.builder.endPtr = local_268.builder.ptr + uVar16;
        local_268.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        local_268.builder.pos = local_268.builder.ptr;
        if (aStack_1f0._16_4_ != 0) {
          index = 0;
          do {
            capnp::_::ListReader::getStructElement(&local_110,(ListReader *)local_1f8,index);
            statement_00._reader.pointers._4_4_ = local_110.pointers._4_4_;
            statement_00._reader.pointers._0_4_ = (int)local_110.pointers;
            statement_00._reader.capTable = local_110.capTable;
            statement_00._reader.segment = local_110.segment;
            statement_00._reader.data = local_110.data;
            statement_00._reader.dataSize = local_110.dataSize;
            statement_00._reader.pointerCount = local_110.pointerCount;
            statement_00._reader._38_2_ = local_110._38_2_;
            statement_00._reader.nestingLimit = local_110.nestingLimit;
            statement_00._reader._44_4_ = local_110._44_4_;
            parseStatement((Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *)local_138,
                           local_248,statement_00,parser_00);
            local_240[0] = local_138[0];
            if (local_138[0] == true) {
              pWStack_228 = (WirePointer *)local_130.value.builder.capTable;
              pwStack_220 = local_130.value.builder.location;
              local_240._8_8_ = local_130.value.builder.tag.content;
              pSStack_230 = local_130.value.builder.segment;
              local_130.value.builder.segment = (SegmentBuilder *)0x0;
              local_130.value.builder.location = (word *)0x0;
            }
            if ((local_138[0] != false) &&
               (local_130.value.builder.segment != (SegmentBuilder *)0x0)) {
              capnp::_::OrphanBuilder::euthanize(&local_130.value.builder);
            }
            if (local_240[0] == '\x01') {
              if (local_268.builder.pos == local_268.builder.endPtr) {
                newSize = (long)local_268.builder.endPtr - (long)local_268.builder.ptr >> 4;
                if (local_268.builder.endPtr == local_268.builder.ptr) {
                  newSize = 4;
                }
                kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::setCapacity
                          (&local_268,newSize);
              }
              ((local_268.builder.pos)->builder).segment = pSStack_230;
              ((local_268.builder.pos)->builder).capTable = (CapTableBuilder *)pWStack_228;
              ((local_268.builder.pos)->builder).location = pwStack_220;
              ((local_268.builder.pos)->builder).tag.content = local_240._8_8_;
              pSStack_230 = (SegmentBuilder *)0x0;
              pwStack_220 = (word *)0x0;
              local_268.builder.pos = local_268.builder.pos + 1;
            }
            if ((local_240[0] == '\x01') && (pSStack_230 != (SegmentBuilder *)0x0)) {
              capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_240 + 8));
            }
            index = index + 1;
          } while (uVar13 != index);
        }
        if (local_268.builder.pos != local_268.builder.endPtr) {
          kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::setCapacity
                    (&local_268,(long)local_268.builder.pos - (long)local_268.builder.ptr >> 5);
        }
        uStack_210 = (long)local_268.builder.pos - (long)local_268.builder.ptr >> 5;
        local_218 = local_268.builder.ptr;
        local_208 = local_268.builder.disposer;
        local_268.builder.ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
        local_268.builder.pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *)0x0;
        local_268.builder.endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
        capnp::_::OrphanBuilder::initStructList
                  ((OrphanBuilder *)&local_110,(local_248->orphanage).arena,
                   (local_248->orphanage).capTable,(ElementCount)uStack_210,(StructSize)0x80002);
        local_c0.location = (word *)CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers);
        local_c0.capTable = (CapTableBuilder *)local_110.data;
        local_c0.tag.content = (uint64_t)local_110.segment;
        local_c0.segment = (SegmentBuilder *)local_110.capTable;
        capnp::_::OrphanBuilder::asStructList
                  ((ListBuilder *)local_138,&local_c0,(StructSize)0x80002);
        if (uStack_210 != 0) {
          lVar12 = 0;
          uVar16 = 0;
          do {
            pOVar4 = local_218;
            capnp::_::ListBuilder::getStructElement
                      ((StructBuilder *)&local_110,(ListBuilder *)local_138,(ElementCount)uVar16);
            capnp::_::OrphanBuilder::asStruct
                      ((StructBuilder *)local_240,
                       (OrphanBuilder *)((long)&(pOVar4->builder).tag.content + lVar12),
                       (StructSize)0x0);
            other.segment._1_7_ = local_240._1_7_;
            other.segment._0_1_ = local_240[0];
            other.capTable = (CapTableBuilder *)local_240._8_8_;
            other.data = pSStack_230;
            other.pointers = pWStack_228;
            other._32_8_ = pwStack_220;
            capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&local_110,other);
            uVar16 = uVar16 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar16 < uStack_210);
        }
        local_e0.capTable = local_c0.capTable;
        local_e0.location = local_c0.location;
        local_e0.tag.content = local_c0.tag.content;
        local_e0.segment = local_c0.segment;
        local_110.data = local_a0.pointers + 2;
        local_110.segment = &(local_a0.segment)->super_SegmentReader;
        local_110.capTable = &(local_a0.capTable)->super_CapTableReader;
        capnp::_::PointerBuilder::adopt((PointerBuilder *)&local_110,&local_e0);
        pMVar18 = local_1b8;
        if (local_e0.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_e0);
        }
        uVar16 = uStack_210;
        pOVar4 = local_218;
        if (local_218 != (Orphan<capnp::compiler::Declaration> *)0x0) {
          local_218 = (Orphan<capnp::compiler::Declaration> *)0x0;
          uStack_210 = 0;
          (**local_208->_vptr_ArrayDisposer)
                    (local_208,pOVar4,0x20,uVar16,uVar16,
                     kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Declaration>,_false>
                     ::destruct);
        }
        pOVar6 = local_268.builder.endPtr;
        pRVar5 = local_268.builder.pos;
        pOVar4 = local_268.builder.ptr;
        if (local_268.builder.ptr != (Orphan<capnp::compiler::Declaration> *)0x0) {
          local_268.builder.ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
          local_268.builder.pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *)0x0;
          local_268.builder.endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
          (**(local_268.builder.disposer)->_vptr_ArrayDisposer)
                    (local_268.builder.disposer,pOVar4,0x20,(long)pRVar5 - (long)pOVar4 >> 5,
                     (long)pOVar6 - (long)pOVar4 >> 5,
                     kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Declaration>,_false>
                     ::destruct);
        }
      }
      else {
        if (0x3f < statement._reader.dataSize) {
          pDVar15 = (DeclParser *)(ulong)*(uint *)((long)statement._reader.data + 4);
        }
        uVar16 = 0;
        if (0x5f < statement._reader.dataSize) {
          uVar16 = (ulong)*(uint *)((long)statement._reader.data + 8);
        }
        (**local_248->errorReporter->_vptr_ErrorReporter)
                  (local_248->errorReporter,pDVar15,uVar16,
                   "This statement should end with a semicolon, not a block.",0x39);
      }
    }
    else if ((sVar9 == 0) && (local_150 == '\x01')) {
      uVar16 = 0;
      uVar14 = 0;
      if (0x3f < statement._reader.dataSize) {
        uVar14 = (ulong)*(uint *)((long)statement._reader.data + 4);
      }
      if (0x5f < statement._reader.dataSize) {
        uVar16 = (ulong)*(uint *)((long)statement._reader.data + 8);
      }
      (**local_248->errorReporter->_vptr_ErrorReporter)
                (local_248->errorReporter,uVar14,uVar16,
                 "This statement should end with a block, not a semicolon.",0x39);
    }
    (pMVar18->ptr).isSet = true;
    (pMVar18->ptr).field_1.value.builder.segment = pSStack_168;
    (pMVar18->ptr).field_1.value.builder.capTable = local_160;
    (pMVar18->ptr).field_1.value.builder.location = pwStack_158;
    (pMVar18->ptr).field_1.value.builder.tag.content = local_178._8_8_;
    pSStack_168 = (SegmentBuilder *)0x0;
    pwStack_158 = (word *)0x0;
    goto LAB_001ae6be;
  }
  if (*(ElementCount *)
       (local_178 + (ulong)(local_1b0.pos.index <= local_1b0.best.index) * 0x20 + -0x28) ==
      local_60.elementCount) {
    if (local_60.elementCount == 0) goto joined_r0x001ae079;
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_1f8,&local_60,local_60.elementCount - 1);
    uVar16 = 0;
    if (0x9f < (uint)aStack_1f0._24_4_) {
      uVar16 = (ulong)*(uint *)&((aStack_1f0.value.decl.builder.segment)->super_SegmentReader).ptr.
                                ptr;
    }
  }
  else {
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_1f8,
               *(ListReader **)
                (local_178 + (ulong)(local_1b0.pos.index <= local_1b0.best.index) * 0x20 + -0x30),
               *(ElementCount *)
                (local_178 + (ulong)(local_1b0.pos.index <= local_1b0.best.index) * 0x20 + -0x28));
    statement._reader.data = aStack_1f0.value.decl.builder.segment;
    statement._reader.dataSize = aStack_1f0._24_4_;
joined_r0x001ae079:
    uVar16 = 0;
    if (0x3f < statement._reader.dataSize) {
      uVar16 = (ulong)*(uint *)((long)&(((SegmentBuilder *)statement._reader.data)->
                                       super_SegmentReader).arena + 4);
    }
  }
  (**local_248->errorReporter->_vptr_ErrorReporter)
            (local_248->errorReporter,uVar16,uVar16,"Parse error.",0xd);
  (pMVar18->ptr).isSet = false;
LAB_001ae6be:
  if ((local_178[0] == '\x01') && (pSStack_168 != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_178 + 8));
  }
  if (local_1b0.parent !=
      (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
       *)0x0) {
    pIVar17 = &local_1b0.best;
    if (local_1b0.best.index < local_1b0.pos.index) {
      pIVar17 = &local_1b0.pos;
    }
    uVar1 = *(uint *)(local_178 +
                     (ulong)(local_1b0.pos.index <= local_1b0.best.index) * 0x20 + -0x28);
    uVar2 = ((local_1b0.parent)->best).index;
    uVar3 = uVar2;
    if (uVar2 < uVar1) {
      uVar3 = uVar1;
    }
    pIVar11 = &(local_1b0.parent)->best;
    if (uVar2 < uVar1) {
      pIVar11 = pIVar17;
    }
    ((local_1b0.parent)->best).container = pIVar11->container;
    ((local_1b0.parent)->best).index = uVar3;
  }
  return pMVar18;
}

Assistant:

kj::Maybe<Orphan<Declaration>> CapnpParser::parseStatement(
    Statement::Reader statement, const DeclParser& parser) {
  auto fullParser = p::sequence(parser, p::endOfInput);

  auto tokens = statement.getTokens();
  ParserInput parserInput(tokens.begin(), tokens.end());

  KJ_IF_MAYBE(output, fullParser(parserInput)) {
    auto builder = output->decl.get();

    if (statement.hasDocComment()) {
      builder.setDocComment(statement.getDocComment());
    }

    builder.setStartByte(statement.getStartByte());
    builder.setEndByte(statement.getEndByte());

    switch (statement.which()) {
      case Statement::LINE:
        if (output->memberParser != nullptr) {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a block, not a semicolon.");
        }
        break;

      case Statement::BLOCK:
        KJ_IF_MAYBE(memberParser, output->memberParser) {
          auto memberStatements = statement.getBlock();
          kj::Vector<Orphan<Declaration>> members(memberStatements.size());
          for (auto memberStatement: memberStatements) {
            KJ_IF_MAYBE(member, parseStatement(memberStatement, *memberParser)) {
              members.add(kj::mv(*member));
            }
          }
          builder.adoptNestedDecls(arrayToList(orphanage, members.releaseAsArray()));
        } else {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a semicolon, not a block.");
        }
        break;
    }

    return kj::mv(output->decl);

  }